

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_node_cstr_alloc(mpack_node_t node,size_t maxlen)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *pcVar3;
  mpack_node_data_t *pmVar4;
  char *ret;
  size_t maxlen_local;
  mpack_node_t node_local;
  
  pmVar4 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    if (maxlen == 0) {
      mpack_node_flag_error(node,mpack_error_bug);
      node_local.tree = (mpack_tree_t *)0x0;
    }
    else if (pmVar4->type == mpack_type_str) {
      if (maxlen - 1 < (ulong)pmVar4->len) {
        mpack_node_flag_error(node,mpack_error_too_big);
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        pcVar3 = mpack_node_data_unchecked(node);
        _Var1 = mpack_str_check_no_null(pcVar3,(ulong)pmVar4->len);
        if (_Var1) {
          node_local.tree = (mpack_tree_t *)malloc((ulong)(pmVar4->len + 1));
          if (node_local.tree == (mpack_tree_t *)0x0) {
            mpack_node_flag_error(node,mpack_error_memory);
            node_local.tree = (mpack_tree_t *)0x0;
          }
          else {
            pcVar3 = mpack_node_data_unchecked(node);
            memcpy(node_local.tree,pcVar3,(ulong)pmVar4->len);
            *(undefined1 *)((long)&(node_local.tree)->error_fn + (ulong)pmVar4->len) = 0;
          }
        }
        else {
          mpack_node_flag_error(node,mpack_error_type);
          node_local.tree = (mpack_tree_t *)0x0;
        }
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (char *)node_local.tree;
}

Assistant:

char* mpack_node_cstr_alloc(mpack_node_t node, size_t maxlen) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    // make sure maxlen makes sense
    if (maxlen < 1) {
        mpack_break("maxlen is zero; you must have room for at least a null-terminator");
        mpack_node_flag_error(node, mpack_error_bug);
        return NULL;
    }

    if (node.data->type != mpack_type_str) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    if (node.data->len > maxlen - 1) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return NULL;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    char* ret = (char*) MPACK_MALLOC((size_t)(node.data->len + 1));
    if (ret == NULL) {
        mpack_node_flag_error(node, mpack_error_memory);
        return NULL;
    }

    mpack_memcpy(ret, mpack_node_data_unchecked(node), node.data->len);
    ret[node.data->len] = '\0';
    return ret;
}